

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSlowShrinking.cpp
# Opt level: O0

bool __thiscall
PropTestSlowFunction::check(PropTestSlowFunction *this,vector<int,_std::allocator<int>_> *v)

{
  bool bVar1;
  ostream *this_00;
  size_type sVar2;
  const_reference pvVar3;
  vector<int,_std::allocator<int>_> *in_RSI;
  atomic<bool> *in_RDI;
  duration<long,_std::ratio<1L,_1L>_> *unaff_retaddr;
  undefined1 in_stack_ffffffffffffffcf;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  duration<long,std::ratio<1l,1l>> local_20 [8];
  vector<int,_std::allocator<int>_> *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (bVar1) {
    this_00 = std::operator<<((ostream *)&std::cout,"Sleeping...");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              (local_20,(int *)&stack0xffffffffffffffdc);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(unaff_retaddr);
  }
  sVar2 = std::vector<int,_std::allocator<int>_>::size(local_18);
  if ((sVar2 < 4) ||
     (pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_18,3), *pvVar3 % 5 != 1)) {
    local_1 = true;
  }
  else {
    std::atomic<bool>::operator=(in_RDI,(bool)in_stack_ffffffffffffffcf);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool check(const std::vector<int>& v) const override {
    if (shrinking) {
      std::cout << "Sleeping..." << std::endl;
      std::this_thread::sleep_for(std::chrono::seconds(1));
    }

    if (v.size() >= 4 && (v[3] % 5) == 1) {
      shrinking = true;
      return false;
    }
    return true;
  }